

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connecter.cpp
# Opt level: O0

void __thiscall zmq::tcp_connecter_t::out_event(tcp_connecter_t *this)

{
  bool bVar1;
  int *piVar2;
  socklen_t in_ECX;
  sockaddr *__addr;
  int in_ESI;
  int __fd;
  tcp_connecter_t *in_RDI;
  session_base_t *unaff_retaddr;
  object_t *in_stack_00000008;
  stream_connecter_base_t *in_stack_00000020;
  fd_t fd;
  string *in_stack_00000070;
  fd_t in_stack_0000007c;
  stream_connecter_base_t *in_stack_00000080;
  socket_end_t in_stack_00000098;
  fd_t in_stack_0000009c;
  int in_stack_ffffffffffffffac;
  stream_connecter_base_t *in_stack_ffffffffffffffb0;
  tcp_connecter_t *in_stack_ffffffffffffffc0;
  string local_30 [36];
  int local_c;
  
  if ((in_RDI->_connect_timer_started & 1U) != 0) {
    in_ESI = 2;
    io_object_t::cancel_timer((io_object_t *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    in_RDI->_connect_timer_started = false;
  }
  stream_connecter_base_t::rm_handle(in_stack_ffffffffffffffb0);
  local_c = connect(in_RDI,in_ESI,__addr,in_ECX);
  if (((local_c == -1) &&
      (((in_RDI->super_stream_connecter_base_t).super_own_t.options.reconnect_stop & 1U) != 0)) &&
     (piVar2 = __errno_location(), *piVar2 == 0x6f)) {
    __fd = (int)(in_RDI->super_stream_connecter_base_t)._session;
    object_t::send_conn_failed(in_stack_00000008,unaff_retaddr);
    stream_connecter_base_t::close(&in_RDI->super_stream_connecter_base_t,__fd);
    own_t::terminate(&in_stack_ffffffffffffffb0->super_own_t);
    return;
  }
  if ((local_c != -1) &&
     (in_ESI = local_c, bVar1 = tune_socket(in_stack_ffffffffffffffc0,(fd_t)((ulong)in_RDI >> 0x20))
     , bVar1)) {
    get_socket_name<zmq::tcp_address_t>(in_stack_0000009c,in_stack_00000098);
    stream_connecter_base_t::create_engine(in_stack_00000080,in_stack_0000007c,in_stack_00000070);
    std::__cxx11::string::~string(local_30);
    return;
  }
  stream_connecter_base_t::close(&in_RDI->super_stream_connecter_base_t,in_ESI);
  stream_connecter_base_t::add_reconnect_timer(in_stack_00000020);
  return;
}

Assistant:

void zmq::tcp_connecter_t::out_event ()
{
    if (_connect_timer_started) {
        cancel_timer (connect_timer_id);
        _connect_timer_started = false;
    }

    //  TODO this is still very similar to (t)ipc_connecter_t, maybe the
    //  differences can be factored out

    rm_handle ();

    const fd_t fd = connect ();

    if (fd == retired_fd
        && ((options.reconnect_stop & ZMQ_RECONNECT_STOP_CONN_REFUSED)
            && errno == ECONNREFUSED)) {
        send_conn_failed (_session);
        close ();
        terminate ();
        return;
    }

    //  Handle the error condition by attempt to reconnect.
    if (fd == retired_fd || !tune_socket (fd)) {
        close ();
        add_reconnect_timer ();
        return;
    }

    create_engine (fd, get_socket_name<tcp_address_t> (fd, socket_end_local));
}